

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O1

int no_err(int val,char *msg)

{
  Error *this;
  undefined8 local_30;
  
  if (-1 < val) {
    return val;
  }
  this = (Error *)__cxa_allocate_exception(0x3f0);
  from_errno_abi_cxx11_();
  Error::Error(this,"%s, %s\n",local_30,msg);
  __cxa_throw(this,&Error::typeinfo,std::exception::~exception);
}

Assistant:

int no_err(int val, const char *msg) {
  if (val < 0) {
    throw Error("%s, %s\n", from_errno().c_str(), msg);
  }
  return val;
}